

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String __thiscall Bstrlib::String::splitWhenNoMore(String *this,String *set)

{
  int iVar1;
  String *in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar2;
  String SVar3;
  int pos;
  String *set_local;
  String *this_local;
  String *ret;
  
  invFindAnyChar(set,in_RDX,0);
  midString(this,(int)set,0);
  iVar1 = bdelete(&set->super_tagbstring,0,(this->super_tagbstring).slen);
  puVar2 = extraout_RDX;
  if (iVar1 == -1) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x604,"Failure in remove");
    puVar2 = extraout_RDX_00;
  }
  SVar3.super_tagbstring.data = puVar2;
  SVar3.super_tagbstring._0_8_ = this;
  return (String)SVar3.super_tagbstring;
}

Assistant:

const String String::splitWhenNoMore(const String & set)
    {
        int pos = invFindAnyChar(set);
        String ret = midString(0, pos == -1 ? slen : pos);
        if (BSTR_ERR == bdelete(this, 0, ret.slen)) bstringThrow("Failure in remove");
        return ret;
    }